

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

int is_smooth(MB_MODE_INFO *mbmi,int plane)

{
  PREDICTION_MODE PVar1;
  UV_PREDICTION_MODE UVar2;
  int iVar3;
  int in_ESI;
  MB_MODE_INFO *in_RDI;
  UV_PREDICTION_MODE uv_mode;
  PREDICTION_MODE mode;
  bool local_18;
  bool local_17;
  uint local_4;
  
  if (in_ESI == 0) {
    PVar1 = in_RDI->mode;
    local_17 = true;
    if ((PVar1 != '\t') && (local_17 = true, PVar1 != '\n')) {
      local_17 = PVar1 == '\v';
    }
    local_4 = (uint)local_17;
  }
  else {
    iVar3 = is_inter_block(in_RDI);
    if (iVar3 == 0) {
      UVar2 = in_RDI->uv_mode;
      local_18 = true;
      if ((UVar2 != '\t') && (local_18 = true, UVar2 != '\n')) {
        local_18 = UVar2 == '\v';
      }
      local_4 = (uint)local_18;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int is_smooth(const MB_MODE_INFO *mbmi, int plane) {
  if (plane == 0) {
    const PREDICTION_MODE mode = mbmi->mode;
    return (mode == SMOOTH_PRED || mode == SMOOTH_V_PRED ||
            mode == SMOOTH_H_PRED);
  } else {
    // uv_mode is not set for inter blocks, so need to explicitly
    // detect that case.
    if (is_inter_block(mbmi)) return 0;

    const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
    return (uv_mode == UV_SMOOTH_PRED || uv_mode == UV_SMOOTH_V_PRED ||
            uv_mode == UV_SMOOTH_H_PRED);
  }
}